

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::client_wait_sync(NegativeTestContext *ctx)

{
  GLsync p_Var1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLsync local_18;
  GLsync sync;
  NegativeTestContext *ctx_local;
  
  sync = (GLsync)ctx;
  local_18 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  p_Var1 = sync;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if sync is not the name of an existing sync object.",
             &local_39);
  NegativeTestContext::beginSection((NegativeTestContext *)p_Var1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glClientWaitSync((CallLogWrapper *)sync,(GLsync)0x0,0,10000);
  NegativeTestContext::expectError((NegativeTestContext *)sync,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)sync);
  p_Var1 = sync;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_VALUE is generated if flags contains any unsupported flag.",&local_71);
  NegativeTestContext::beginSection((NegativeTestContext *)p_Var1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glClientWaitSync((CallLogWrapper *)sync,local_18,4,10000);
  NegativeTestContext::expectError((NegativeTestContext *)sync,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)sync);
  glu::CallLogWrapper::glDeleteSync((CallLogWrapper *)sync,local_18);
  return;
}

Assistant:

void client_wait_sync (NegativeTestContext& ctx)
{
	GLsync sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if sync is not the name of an existing sync object.");
	ctx.glClientWaitSync (0, 0, 10000);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if flags contains any unsupported flag.");
	ctx.glClientWaitSync(sync, 0x00000004, 10000);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteSync(sync);
}